

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

opStatus __thiscall llvm::detail::IEEEFloat::next(IEEEFloat *this,bool nextDown)

{
  short sVar1;
  uint uVar2;
  byte bVar3;
  bool bVar4;
  fltSemantics *pfVar5;
  undefined7 in_register_00000031;
  Significand *pSVar6;
  opStatus oVar7;
  opStatus oVar8;
  
  bVar3 = this->field_0x12;
  if ((int)CONCAT71(in_register_00000031,nextDown) != 0) {
    bVar3 = bVar3 ^ 8;
    this->field_0x12 = bVar3;
  }
  oVar7 = opOK;
  oVar8 = opOK;
  switch(bVar3 & 7) {
  case 0:
    oVar8 = oVar7;
    if ((bVar3 & 8) != 0) {
      makeLargest(this,true);
    }
    break;
  case 1:
    bVar4 = isSignaling(this);
    oVar8 = oVar7;
    if (bVar4) {
      makeNaN(this,false,(bool)((this->field_0x12 & 8) >> 3),(APInt *)0x0);
      oVar8 = opInvalidOp;
    }
    break;
  case 2:
    bVar4 = isSmallest(this);
    if ((bVar4) && ((this->field_0x12 & 8) != 0)) {
      uVar2 = this->semantics->precision;
      if (uVar2 - 0x40 < 0xffffff80) {
        pSVar6 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar6 = &this->significand;
      }
      APInt::tcSet(&pSVar6->part,0,uVar2 + 0x40 >> 6);
      this->field_0x12 = this->field_0x12 & 0xf8 | 3;
      this->exponent = 0;
      oVar8 = opOK;
      break;
    }
    bVar4 = isLargest(this);
    if (bVar4) {
      if ((this->field_0x12 & 8) == 0) {
        uVar2 = this->semantics->precision;
        if (uVar2 - 0x40 < 0xffffff80) {
          pSVar6 = (Significand *)(this->significand).parts;
        }
        else {
          pSVar6 = &this->significand;
        }
        APInt::tcSet(&pSVar6->part,0,uVar2 + 0x40 >> 6);
        this->field_0x12 = this->field_0x12 & 0xf8;
        sVar1 = this->semantics->maxExponent;
LAB_00158edf:
        this->exponent = sVar1 + 1;
        oVar8 = opOK;
        break;
      }
    }
    else if ((this->field_0x12 & 8) == 0) {
      bVar4 = isDenormal(this);
      if ((bVar4) || (bVar4 = isSignificandAllOnes(this), !bVar4)) {
        incrementSignificand(this);
        oVar8 = oVar7;
        break;
      }
      uVar2 = this->semantics->precision;
      if (uVar2 - 0x40 < 0xffffff80) {
        pSVar6 = (Significand *)(this->significand).parts;
      }
      else {
        pSVar6 = &this->significand;
      }
      APInt::tcSet(&pSVar6->part,0,uVar2 + 0x40 >> 6);
      APInt::tcSetBit(&pSVar6->part,this->semantics->precision - 1);
      sVar1 = this->exponent;
      if (sVar1 == this->semantics->maxExponent) {
        __assert_fail("exponent != semantics->maxExponent && \"We can not increment an exponent beyond the maxExponent allowed\" \" by the given floating point semantics.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0xeac,"IEEEFloat::opStatus llvm::detail::IEEEFloat::next(bool)");
      }
      goto LAB_00158edf;
    }
    pfVar5 = this->semantics;
    if (this->exponent == pfVar5->minExponent) {
      bVar4 = false;
    }
    else {
      bVar4 = isSignificandAllZeros(this);
      pfVar5 = this->semantics;
    }
    if (pfVar5->precision - 0x40 < 0xffffff80) {
      pSVar6 = (Significand *)(this->significand).parts;
    }
    else {
      pSVar6 = &this->significand;
    }
    APInt::tcDecrement(&pSVar6->part,pfVar5->precision + 0x40 >> 6);
    oVar8 = opOK;
    if (bVar4 != false) {
      APInt::tcSetBit(&pSVar6->part,this->semantics->precision - 1);
      this->exponent = this->exponent + -1;
    }
    break;
  case 3:
    makeSmallest(this,false);
    oVar8 = opOK;
  }
  if (nextDown) {
    this->field_0x12 = this->field_0x12 ^ 8;
  }
  return oVar8;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::next(bool nextDown) {
  // If we are performing nextDown, swap sign so we have -x.
  if (nextDown)
    changeSign();

  // Compute nextUp(x)
  opStatus result = opOK;

  // Handle each float category separately.
  switch (category) {
  case fcInfinity:
    // nextUp(+inf) = +inf
    if (!isNegative())
      break;
    // nextUp(-inf) = -getLargest()
    makeLargest(true);
    break;
  case fcNaN:
    // IEEE-754R 2008 6.2 Par 2: nextUp(sNaN) = qNaN. Set Invalid flag.
    // IEEE-754R 2008 6.2: nextUp(qNaN) = qNaN. Must be identity so we do not
    //                     change the payload.
    if (isSignaling()) {
      result = opInvalidOp;
      // For consistency, propagate the sign of the sNaN to the qNaN.
      makeNaN(false, isNegative(), nullptr);
    }
    break;
  case fcZero:
    // nextUp(pm 0) = +getSmallest()
    makeSmallest(false);
    break;
  case fcNormal:
    // nextUp(-getSmallest()) = -0
    if (isSmallest() && isNegative()) {
      APInt::tcSet(significandParts(), 0, partCount());
      category = fcZero;
      exponent = 0;
      break;
    }

    // nextUp(getLargest()) == INFINITY
    if (isLargest() && !isNegative()) {
      APInt::tcSet(significandParts(), 0, partCount());
      category = fcInfinity;
      exponent = semantics->maxExponent + 1;
      break;
    }

    // nextUp(normal) == normal + inc.
    if (isNegative()) {
      // If we are negative, we need to decrement the significand.

      // We only cross a binade boundary that requires adjusting the exponent
      // if:
      //   1. exponent != semantics->minExponent. This implies we are not in the
      //   smallest binade or are dealing with denormals.
      //   2. Our significand excluding the integral bit is all zeros.
      bool WillCrossBinadeBoundary =
        exponent != semantics->minExponent && isSignificandAllZeros();

      // Decrement the significand.
      //
      // We always do this since:
      //   1. If we are dealing with a non-binade decrement, by definition we
      //   just decrement the significand.
      //   2. If we are dealing with a normal -> normal binade decrement, since
      //   we have an explicit integral bit the fact that all bits but the
      //   integral bit are zero implies that subtracting one will yield a
      //   significand with 0 integral bit and 1 in all other spots. Thus we
      //   must just adjust the exponent and set the integral bit to 1.
      //   3. If we are dealing with a normal -> denormal binade decrement,
      //   since we set the integral bit to 0 when we represent denormals, we
      //   just decrement the significand.
      integerPart *Parts = significandParts();
      APInt::tcDecrement(Parts, partCount());

      if (WillCrossBinadeBoundary) {
        // Our result is a normal number. Do the following:
        // 1. Set the integral bit to 1.
        // 2. Decrement the exponent.
        APInt::tcSetBit(Parts, semantics->precision - 1);
        exponent--;
      }
    } else {
      // If we are positive, we need to increment the significand.

      // We only cross a binade boundary that requires adjusting the exponent if
      // the input is not a denormal and all of said input's significand bits
      // are set. If all of said conditions are true: clear the significand, set
      // the integral bit to 1, and increment the exponent. If we have a
      // denormal always increment since moving denormals and the numbers in the
      // smallest normal binade have the same exponent in our representation.
      bool WillCrossBinadeBoundary = !isDenormal() && isSignificandAllOnes();

      if (WillCrossBinadeBoundary) {
        integerPart *Parts = significandParts();
        APInt::tcSet(Parts, 0, partCount());
        APInt::tcSetBit(Parts, semantics->precision - 1);
        assert(exponent != semantics->maxExponent &&
               "We can not increment an exponent beyond the maxExponent allowed"
               " by the given floating point semantics.");
        exponent++;
      } else {
        incrementSignificand();
      }
    }
    break;
  }

  // If we are performing nextDown, swap sign so we have -nextUp(-x)
  if (nextDown)
    changeSign();

  return result;
}